

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image * rf_get_frame_from_gif(rf_image *__return_storage_ptr__,rf_gif gif,int frame)

{
  int iVar1;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (gif.field_2.image.valid == true) {
    iVar1 = 0;
    if (gif.field_2.image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
      iVar1 = *(int *)(&DAT_0017a7c8 +
                      (ulong)(gif.field_2.image.format - RF_UNCOMPRESSED_GRAYSCALE) * 4);
    }
    __return_storage_ptr__->data =
         (void *)((long)gif.field_2.image.data +
                 (long)((gif.field_2.image.height / gif.frames_count) * iVar1 *
                       (gif.field_2.image.width / gif.frames_count) * frame));
    __return_storage_ptr__->width = gif.field_2.image.width / gif.frames_count;
    __return_storage_ptr__->height = gif.field_2.image.height / gif.frames_count;
    __return_storage_ptr__->format = gif.field_2.image.format;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_get_frame_from_gif(rf_gif gif, int frame)
{
    rf_image result = {0};

    if (gif.valid)
    {
        rf_sizei size = rf_gif_frame_size(gif);

        result = (rf_image)
        {
            .data   = ((unsigned char*)gif.data) + (size.width * size.height * rf_bytes_per_pixel(gif.format)) * frame,
            .width  = size.width,
            .height = size.height,
            .format = gif.format,
            .valid  = true,
        };
    }

    return result;
}